

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<char>
          (BasicWriter<wchar_t> *this,char *s,size_t size,AlignSpec *spec)

{
  long lVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  CharPtr pwVar13;
  long lVar14;
  int iVar20;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar10 = (ulong)(spec->super_WidthSpec).width_;
  puVar3 = *(undefined8 **)(this + 8);
  lVar9 = puVar3[2];
  if (size < uVar10) {
    uVar10 = uVar10 + lVar9;
    puVar8 = puVar3;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
      puVar8 = *(undefined8 **)(this + 8);
    }
    puVar3[2] = uVar10;
    auVar6 = _DAT_00145b90;
    auVar5 = _DAT_001419b0;
    auVar4 = _DAT_001419a0;
    lVar11 = puVar8[1];
    pwVar13 = (CharPtr)(lVar11 + lVar9 * 4);
    uVar10 = (ulong)(spec->super_WidthSpec).width_;
    wVar2 = (spec->super_WidthSpec).fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar7 = uVar10 - size >> 1;
      if (1 < uVar10 - size) {
        uVar12 = uVar7 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar25._8_4_ = (int)uVar12;
        auVar25._0_8_ = uVar12;
        auVar25._12_4_ = (int)(uVar12 >> 0x20);
        lVar1 = lVar11 + lVar9 * 4;
        lVar14 = 0;
        auVar25 = auVar25 ^ _DAT_001419b0;
        do {
          auVar22._8_4_ = (int)lVar14;
          auVar22._0_8_ = lVar14;
          auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar26 = (auVar22 | auVar4) ^ auVar5;
          iVar20 = auVar25._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar20 && auVar25._0_4_ < auVar26._0_4_ ||
                      iVar20 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar14 * 4) = wVar2;
          }
          if ((auVar26._12_4_ != auVar25._12_4_ || auVar26._8_4_ <= auVar25._8_4_) &&
              auVar26._12_4_ <= auVar25._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar14 * 4) = wVar2;
          }
          auVar22 = (auVar22 | auVar6) ^ auVar5;
          iVar27 = auVar22._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar22._0_4_ <= auVar25._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar14 * 4) = wVar2;
            *(wchar_t *)(lVar1 + 0xc + lVar14 * 4) = wVar2;
          }
          lVar14 = lVar14 + 4;
        } while ((uVar12 - ((uint)(uVar7 + 0x3fffffffffffffff) & 3)) + 4 != lVar14);
      }
      auVar6 = _DAT_00145b90;
      auVar5 = _DAT_001419b0;
      auVar4 = _DAT_001419a0;
      pwVar13 = pwVar13 + uVar7;
      if (uVar10 != size) {
        uVar10 = (uVar10 * 4 + (uVar7 + size) * -4) - 4;
        auVar26._8_4_ = (int)uVar10;
        auVar26._0_8_ = uVar10;
        auVar26._12_4_ = (int)(uVar10 >> 0x20);
        auVar17._0_8_ = uVar10 >> 2;
        auVar17._8_8_ = auVar26._8_8_ >> 2;
        lVar11 = lVar11 + size * 4 + lVar9 * 4 + uVar7 * 4;
        uVar7 = 0;
        auVar17 = auVar17 ^ _DAT_001419b0;
        do {
          auVar23._8_4_ = (int)uVar7;
          auVar23._0_8_ = uVar7;
          auVar23._12_4_ = (int)(uVar7 >> 0x20);
          auVar25 = (auVar23 | auVar4) ^ auVar5;
          iVar20 = auVar17._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar17._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar11 + uVar7 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar17._12_4_ || auVar25._8_4_ <= auVar17._8_4_) &&
              auVar25._12_4_ <= auVar17._12_4_) {
            *(wchar_t *)(lVar11 + 4 + uVar7 * 4) = wVar2;
          }
          auVar25 = (auVar23 | auVar6) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar17._0_4_)) {
            *(wchar_t *)(lVar11 + 8 + uVar7 * 4) = wVar2;
            *(wchar_t *)(lVar11 + 0xc + uVar7 * 4) = wVar2;
          }
          uVar7 = uVar7 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar10 - size != 0) {
        uVar7 = (uVar10 * 4 + size * -4) - 4;
        auVar15._8_4_ = (int)uVar7;
        auVar15._0_8_ = uVar7;
        auVar15._12_4_ = (int)(uVar7 >> 0x20);
        auVar16._0_8_ = uVar7 >> 2;
        auVar16._8_8_ = auVar15._8_8_ >> 2;
        lVar11 = lVar11 + lVar9 * 4;
        uVar12 = 0;
        auVar16 = auVar16 ^ _DAT_001419b0;
        do {
          auVar21._8_4_ = (int)uVar12;
          auVar21._0_8_ = uVar12;
          auVar21._12_4_ = (int)(uVar12 >> 0x20);
          auVar25 = (auVar21 | auVar4) ^ auVar5;
          iVar20 = auVar16._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar20 && auVar16._0_4_ < auVar25._0_4_ ||
                      iVar20 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar11 + uVar12 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar16._12_4_ || auVar25._8_4_ <= auVar16._8_4_) &&
              auVar25._12_4_ <= auVar16._12_4_) {
            *(wchar_t *)(lVar11 + 4 + uVar12 * 4) = wVar2;
          }
          auVar25 = (auVar21 | auVar6) ^ auVar5;
          iVar27 = auVar25._4_4_;
          if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar16._0_4_)) {
            *(wchar_t *)(lVar11 + 8 + uVar12 * 4) = wVar2;
            *(wchar_t *)(lVar11 + 0xc + uVar12 * 4) = wVar2;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar7 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
      pwVar13 = pwVar13 + (uVar10 - size);
    }
    else if (uVar10 != size) {
      uVar10 = (uVar10 * 4 + size * -4) - 4;
      auVar18._8_4_ = (int)uVar10;
      auVar18._0_8_ = uVar10;
      auVar18._12_4_ = (int)(uVar10 >> 0x20);
      auVar19._0_8_ = uVar10 >> 2;
      auVar19._8_8_ = auVar18._8_8_ >> 2;
      lVar11 = lVar11 + size * 4 + lVar9 * 4;
      uVar7 = 0;
      auVar19 = auVar19 ^ _DAT_001419b0;
      do {
        auVar24._8_4_ = (int)uVar7;
        auVar24._0_8_ = uVar7;
        auVar24._12_4_ = (int)(uVar7 >> 0x20);
        auVar25 = (auVar24 | auVar4) ^ auVar5;
        iVar20 = auVar19._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar20 && auVar19._0_4_ < auVar25._0_4_ ||
                    iVar20 < auVar25._4_4_) & 1)) {
          *(wchar_t *)(lVar11 + uVar7 * 4) = wVar2;
        }
        if ((auVar25._12_4_ != auVar19._12_4_ || auVar25._8_4_ <= auVar19._8_4_) &&
            auVar25._12_4_ <= auVar19._12_4_) {
          *(wchar_t *)(lVar11 + 4 + uVar7 * 4) = wVar2;
        }
        auVar25 = (auVar24 | auVar6) ^ auVar5;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar20 && (iVar27 != iVar20 || auVar25._0_4_ <= auVar19._0_4_)) {
          *(wchar_t *)(lVar11 + 8 + uVar7 * 4) = wVar2;
          *(wchar_t *)(lVar11 + 0xc + uVar7 * 4) = wVar2;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
    }
  }
  else {
    uVar10 = lVar9 + size;
    puVar8 = puVar3;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
      puVar8 = *(undefined8 **)(this + 8);
    }
    puVar3[2] = uVar10;
    pwVar13 = (CharPtr)(lVar9 * 4 + puVar8[1]);
  }
  if (0 < (long)size) {
    uVar10 = size + 1;
    lVar9 = 0;
    do {
      pwVar13[lVar9] = (int)s[lVar9];
      uVar10 = uVar10 - 1;
      lVar9 = lVar9 + 1;
    } while (1 < uVar10);
  }
  return pwVar13;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}